

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::ProcessBlockEntry(metadata_map_t *m,BlockEntry *block_entry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  const_iterator cVar3;
  longlong local_20;
  
  iVar2 = (*block_entry->_vptr_BlockEntry[2])(block_entry);
  local_20 = mkvparser::Block::GetTrackNumber((Block *)CONCAT44(extraout_var,iVar2));
  cVar3 = std::
          _Rb_tree<long,_std::pair<const_long,_libwebm::vttdemux::MetadataInfo>,_std::_Select1st<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
          ::find(&m->_M_t,&local_20);
  if ((_Rb_tree_header *)cVar3._M_node == &(m->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = true;
  }
  else {
    iVar2 = (*block_entry->_vptr_BlockEntry[3])(block_entry);
    if (iVar2 == 2) {
      bVar1 = WriteCue((FILE *)cVar3._M_node[1]._M_left,(BlockGroup *)block_entry);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool vttdemux::ProcessBlockEntry(const metadata_map_t& m,
                                 const mkvparser::BlockEntry* block_entry) {
  // If the track number for this block is in the cache, then we have
  // a metadata block, so write the WebVTT cue to the output file.

  const mkvparser::Block* const block = block_entry->GetBlock();
  const long long tn = block->GetTrackNumber();  // NOLINT

  typedef metadata_map_t::const_iterator iter_t;
  const iter_t i = m.find(static_cast<metadata_map_t::key_type>(tn));

  if (i == m.end())  // not a metadata track
    return true;  // nothing else to do

  if (block_entry->GetKind() != mkvparser::BlockEntry::kBlockGroup)
    return false;  // weird

  typedef mkvparser::BlockGroup BG;
  const BG* const block_group = static_cast<const BG*>(block_entry);

  const MetadataInfo& info = i->second;
  FILE* const f = info.file;

  return WriteCue(f, block_group);
}